

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O3

cmCTestGenericHandler * __thiscall
cmCTestConfigureCommand::InitializeHandler(cmCTestConfigureCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmCTest *pcVar3;
  cmMakefile *pcVar4;
  bool bVar5;
  uint uVar6;
  char *pcVar7;
  cmCTestGenericHandler *pcVar8;
  cmake *this_00;
  size_t sVar9;
  cmGlobalGenerator *pcVar10;
  ostream *poVar11;
  string *psVar12;
  _Alloc_hider _Var13;
  pointer pbVar14;
  bool bVar15;
  string option;
  string cmakelists_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string cmakeConfigureCommand;
  string local_258;
  string local_238;
  uint local_214;
  long *local_210;
  long local_208;
  long local_200 [2];
  string local_1f0;
  char *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar7 = (this->super_cmCTestHandlerCommand).Values.
           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start[6];
  if (pcVar7 != (char *)0x0) {
    std::__cxx11::string::string((string *)local_1a8,pcVar7,(allocator *)&local_258);
    cmSystemTools::ExpandListArgument((string *)local_1a8,&local_1c8,false);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  paVar1 = &local_258.field_2;
  local_258._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"BuildDirectory","");
  cmCTest::GetCTestConfiguration((string *)local_1a8,pcVar3,&local_258);
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1a8 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != paVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar1) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  local_1a8._0_8_ = paVar2;
  if (local_1a8._8_8_ == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Build directory not specified. Either use BUILD argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY variable"
               ,"");
    cmCommand::SetError((cmCommand *)this,(string *)local_1a8);
LAB_002dbfc7:
    local_258.field_2._M_allocated_capacity = local_1a8._16_8_;
    _Var13._M_p = (pointer)local_1a8._0_8_;
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
LAB_002dbfdc:
      operator_delete(_Var13._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar4 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CTEST_CONFIGURE_COMMAND","");
    pcVar7 = cmMakefile::GetDefinition(pcVar4,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != paVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
                 pcVar7,(this->super_cmCTestHandlerCommand).Quiet);
LAB_002dbd6f:
      pcVar8 = cmCTest::GetInitializedHandler
                         ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"configure"
                         );
      if (pcVar8 != (cmCTestGenericHandler *)0x0) {
        pcVar8->Quiet = (this->super_cmCTestHandlerCommand).Quiet;
        goto LAB_002dbfe7;
      }
      local_1a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1a8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"internal CTest error. Cannot instantiate configure handler",""
                );
      cmCommand::SetError((cmCommand *)this,(string *)local_1a8);
      goto LAB_002dbfc7;
    }
    pcVar4 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1a8._0_8_ = paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CTEST_CMAKE_GENERATOR","");
    pcVar7 = cmMakefile::GetDefinition(pcVar4,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != paVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
      local_1a8._0_8_ = paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,
                 "Configure command is not specified. If this is a \"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, set CTEST_CONFIGURE_COMMAND."
                 ,"");
      cmCommand::SetError((cmCommand *)this,(string *)local_1a8);
      goto LAB_002dbfc7;
    }
    pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_1a8._0_8_ = paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"SourceDirectory","");
    cmCTest::GetCTestConfiguration(&local_258,pcVar3,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != paVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (local_258._M_string_length == 0) {
      local_1a8._0_8_ = paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,
                 "Source directory not specified. Either use SOURCE argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY variable"
                 ,"");
      cmCommand::SetError((cmCommand *)this,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != paVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      _Var13._M_p = local_258._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p == paVar1) goto LAB_002dbfe4;
      goto LAB_002dbfdc;
    }
    local_210 = local_200;
    local_1d0 = pcVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,local_258._M_dataplus._M_p,
               local_258._M_dataplus._M_p + local_258._M_string_length);
    std::__cxx11::string::append((char *)&local_210);
    bVar5 = cmsys::SystemTools::FileExists((char *)local_210);
    if (bVar5) {
      this_00 = cmMakefile::GetCMakeInstance
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                           Makefile);
      pcVar7 = local_1d0;
      local_1a8._0_8_ = paVar2;
      sVar9 = strlen(local_1d0);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar7,pcVar7 + sVar9);
      pcVar10 = cmake::CreateGlobalGenerator(this_00,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != paVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (pcVar10 == (cmGlobalGenerator *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = (*pcVar10->_vptr_cmGlobalGenerator[0x1b])(pcVar10);
        (*pcVar10->_vptr_cmGlobalGenerator[1])(pcVar10);
      }
      local_1a8._0_8_ = paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"\"","");
      psVar12 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::__cxx11::string::_M_append(local_1a8,(ulong)(psVar12->_M_dataplus)._M_p);
      std::__cxx11::string::append(local_1a8);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      local_238._M_string_length = 0;
      local_238.field_2._M_local_buf[0] = '\0';
      local_214 = uVar6;
      if (local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar15 = false;
      }
      else {
        bVar15 = false;
        pbVar14 = local_1c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__cxx11::string::_M_assign((string *)&local_238);
          std::__cxx11::string::append(local_1a8);
          std::__cxx11::string::_M_append(local_1a8,(ulong)local_238._M_dataplus._M_p);
          std::__cxx11::string::append(local_1a8);
          _Var13._M_p = local_238._M_dataplus._M_p;
          pcVar7 = strstr(local_238._M_dataplus._M_p,"CMAKE_BUILD_TYPE=");
          if ((pcVar7 != (char *)0x0) ||
             (pcVar7 = strstr(_Var13._M_p,"CMAKE_BUILD_TYPE:STRING="), pcVar7 != (char *)0x0)) {
            bVar15 = true;
          }
          pbVar14 = pbVar14 + 1;
        } while (pbVar14 !=
                 local_1c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (((local_214 & 1) == 0 && !bVar15) &&
         (psVar12 = cmCTest::GetConfigType_abi_cxx11_
                              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest),
         psVar12->_M_string_length != 0)) {
        std::__cxx11::string::append(local_1a8);
        psVar12 = cmCTest::GetConfigType_abi_cxx11_
                            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
        std::__cxx11::string::_M_append(local_1a8,(ulong)(psVar12->_M_dataplus)._M_p);
        std::__cxx11::string::append(local_1a8);
      }
      std::__cxx11::string::append(local_1a8);
      std::__cxx11::string::append(local_1a8);
      std::__cxx11::string::append(local_1a8);
      pcVar4 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      paVar1 = &local_1f0.field_2;
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"CTEST_CMAKE_GENERATOR_PLATFORM","");
      pcVar7 = cmMakefile::GetDefinition(pcVar4,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
        std::__cxx11::string::append(local_1a8);
        std::__cxx11::string::append(local_1a8);
        std::__cxx11::string::append(local_1a8);
      }
      pcVar4 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"CTEST_CMAKE_GENERATOR_TOOLSET","");
      pcVar7 = cmMakefile::GetDefinition(pcVar4,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
        std::__cxx11::string::append(local_1a8);
        std::__cxx11::string::append(local_1a8);
        std::__cxx11::string::append(local_1a8);
      }
      std::__cxx11::string::append(local_1a8);
      std::__cxx11::string::_M_append(local_1a8,(ulong)local_258._M_dataplus._M_p);
      std::__cxx11::string::append(local_1a8);
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
                 (char *)local_1a8._0_8_,(this->super_cmCTestHandlerCommand).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"CMakeLists.txt file does not exist [",0x24);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)local_210,local_208);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError((cmCommand *)this,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) goto LAB_002dbd6f;
  }
LAB_002dbfe4:
  pcVar8 = (cmCTestGenericHandler *)0x0;
LAB_002dbfe7:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  return pcVar8;
}

Assistant:

cmCTestGenericHandler* cmCTestConfigureCommand::InitializeHandler()
{
  std::vector<std::string> options;

  if (this->Values[ctc_OPTIONS])
    {
    cmSystemTools::ExpandListArgument(this->Values[ctc_OPTIONS], options);
    }

  if ( this->CTest->GetCTestConfiguration("BuildDirectory").empty() )
    {
    this->SetError("Build directory not specified. Either use BUILD "
      "argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY "
      "variable");
    return 0;
    }

  const char* ctestConfigureCommand
    = this->Makefile->GetDefinition("CTEST_CONFIGURE_COMMAND");

  if ( ctestConfigureCommand && *ctestConfigureCommand )
    {
    this->CTest->SetCTestConfiguration("ConfigureCommand",
      ctestConfigureCommand, this->Quiet);
    }
  else
    {
    const char* cmakeGeneratorName
      = this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    if ( cmakeGeneratorName && *cmakeGeneratorName )
      {
      const std::string& source_dir
        = this->CTest->GetCTestConfiguration("SourceDirectory");
      if ( source_dir.empty() )
        {
        this->SetError("Source directory not specified. Either use SOURCE "
          "argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY "
          "variable");
        return 0;
        }

      const std::string cmakelists_file = source_dir + "/CMakeLists.txt";
      if ( !cmSystemTools::FileExists(cmakelists_file.c_str()) )
        {
        std::ostringstream e;
        e << "CMakeLists.txt file does not exist ["
          << cmakelists_file << "]";
        this->SetError(e.str());
        return 0;
        }

      bool multiConfig = false;
      bool cmakeBuildTypeInOptions = false;

      cmGlobalGenerator *gg =
        this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
          cmakeGeneratorName);
      if(gg)
        {
        multiConfig = gg->IsMultiConfig();
        delete gg;
        }

      std::string cmakeConfigureCommand = "\"";
      cmakeConfigureCommand += cmSystemTools::GetCMakeCommand();
      cmakeConfigureCommand += "\"";

      std::vector<std::string>::const_iterator it;
      std::string option;
      for (it= options.begin(); it!=options.end(); ++it)
        {
        option = *it;

        cmakeConfigureCommand += " \"";
        cmakeConfigureCommand += option;
        cmakeConfigureCommand += "\"";

        if ((0 != strstr(option.c_str(), "CMAKE_BUILD_TYPE=")) ||
           (0 != strstr(option.c_str(), "CMAKE_BUILD_TYPE:STRING=")))
          {
          cmakeBuildTypeInOptions = true;
          }
        }

      if (!multiConfig && !cmakeBuildTypeInOptions &&
          !this->CTest->GetConfigType().empty())
        {
        cmakeConfigureCommand += " \"-DCMAKE_BUILD_TYPE:STRING=";
        cmakeConfigureCommand += this->CTest->GetConfigType();
        cmakeConfigureCommand += "\"";
        }

      cmakeConfigureCommand += " \"-G";
      cmakeConfigureCommand += cmakeGeneratorName;
      cmakeConfigureCommand += "\"";

      const char* cmakeGeneratorPlatform =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_PLATFORM");
      if(cmakeGeneratorPlatform && *cmakeGeneratorPlatform)
        {
        cmakeConfigureCommand += " \"-A";
        cmakeConfigureCommand += cmakeGeneratorPlatform;
        cmakeConfigureCommand += "\"";
        }

      const char* cmakeGeneratorToolset =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_TOOLSET");
      if(cmakeGeneratorToolset && *cmakeGeneratorToolset)
        {
        cmakeConfigureCommand += " \"-T";
        cmakeConfigureCommand += cmakeGeneratorToolset;
        cmakeConfigureCommand += "\"";
        }

      cmakeConfigureCommand += " \"";
      cmakeConfigureCommand += source_dir;
      cmakeConfigureCommand += "\"";

      this->CTest->SetCTestConfiguration("ConfigureCommand",
        cmakeConfigureCommand.c_str(), this->Quiet);
      }
    else
      {
      this->SetError("Configure command is not specified. If this is a "
        "\"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, "
        "set CTEST_CONFIGURE_COMMAND.");
      return 0;
      }
    }

  cmCTestGenericHandler* handler
    = this->CTest->GetInitializedHandler("configure");
  if ( !handler )
    {
    this->SetError(
      "internal CTest error. Cannot instantiate configure handler");
    return 0;
    }
  handler->SetQuiet(this->Quiet);
  return handler;
}